

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

unit_data __thiscall units::detail::unit_data::root(unit_data *this,int power)

{
  bool bVar1;
  uint local_80;
  int power_local;
  unit_data *this_local;
  
  bVar1 = hasValidRoot(this,power);
  if (bVar1) {
    if (power % 2 == 0) {
      local_80 = 0;
    }
    else {
      local_80 = (uint)*this >> 0x1d & 1;
    }
    unit_data((unit_data *)((long)&this_local + 4),(((int)*this << 0x1c) >> 0x1c) / power,
              (((int)*this << 0x15) >> 0x1d) / power,(((int)*this << 0x18) >> 0x1c) / power,
              (((int)*this << 0x12) >> 0x1d) / power,(((int)*this << 0xd) >> 0x1d) / power,
              (((int)*this << 0xb) >> 0x1e) / power,(((int)*this << 0x10) >> 0x1e) / power,
              (((int)*this << 6) >> 0x1e) / power,(((int)*this << 4) >> 0x1e) / power,
              (((int)*this << 8) >> 0x1d) / power,(uint)*this >> 0x1c & 1,local_80,
              (uint)*this >> 0x1e & 1,0);
  }
  else {
    unit_data((unit_data *)((long)&this_local + 4),(nullptr_t)0x0);
  }
  return this_local._4_4_;
}

Assistant:

constexpr unit_data root(int power) const
        {
            return (hasValidRoot(power)) ? unit_data(
                                               meter_ / power,
                                               kilogram_ / power,
                                               second_ / power,
                                               ampere_ / power,
                                               kelvin_ / power,
                                               mole_ / power,
                                               candela_ / power,
                                               currency_ / power,
                                               count_ / power,
                                               radians_ / power,
                                               per_unit_,
                                               (power % 2 == 0) ? 0U : i_flag_,
                                               e_flag_,
                                               0) :
                                           unit_data(nullptr);
        }